

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

pair<subprocess::Buffer,_subprocess::Buffer> * __thiscall
subprocess::detail::Communication::communicate
          (pair<subprocess::Buffer,_subprocess::Buffer> *__return_storage_ptr__,Communication *this,
          char *msg,size_t length)

{
  FILE *__s;
  int iVar1;
  difference_type dVar2;
  size_t sVar3;
  int *piVar4;
  OSError *pOVar5;
  Streams *pSVar6;
  long in_FS_OFFSET;
  allocator<char> local_a9;
  ErrBuffer ebuf;
  OutBuffer obuf;
  string local_68;
  element_type *local_48;
  element_type *local_40;
  element_type *local_38;
  _IO_FILE *local_30;
  
  local_30 = *(_IO_FILE **)(in_FS_OFFSET + 0x28);
  pSVar6 = this->stream_;
  local_48 = (pSVar6->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = (pSVar6->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = (pSVar6->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  obuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  dVar2 = std::
          __count_if<_IO_FILE*const*,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                    (&local_48,&local_30,(_Iter_equals_val<const_std::nullptr_t>)&obuf);
  if ((int)dVar2 < 2) {
    communicate_threaded(__return_storage_ptr__,this,msg,length);
  }
  else {
    obuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    obuf.length = 0;
    obuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    obuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ebuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ebuf.length = 0;
    ebuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    ebuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pSVar6 = this->stream_;
    __s = (FILE *)(pSVar6->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__s == (FILE *)0x0) {
      if ((pSVar6->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::vector<char,_std::allocator<char>_>::resize(&obuf.buf,this->out_buf_cap_);
        iVar1 = util::read_all((this->stream_->output_).
                               super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               &obuf.buf);
        if (iVar1 == -1) {
          pOVar5 = (OSError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"read to obuf failed",&local_a9);
          piVar4 = __errno_location();
          OSError::OSError(pOVar5,&local_68,*piVar4);
          if (*(_IO_FILE **)(in_FS_OFFSET + 0x28) == local_30) {
            __cxa_throw(pOVar5,&OSError::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00602864;
        }
        obuf.length = (size_t)iVar1;
        pSVar6 = (Streams *)&this->stream_->output_;
        goto LAB_00602652;
      }
      if ((pSVar6->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::vector<char,_std::allocator<char>_>::resize(&ebuf.buf,this->err_buf_cap_);
        iVar1 = util::read_atmost_n((this->stream_->error_).
                                    super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                    ebuf.buf.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    .super__Vector_impl_data._M_start,
                                    (long)ebuf.buf.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)ebuf.buf.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
        if (iVar1 == -1) {
          pOVar5 = (OSError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"read to ebuf failed",&local_a9);
          piVar4 = __errno_location();
          OSError::OSError(pOVar5,&local_68,*piVar4);
          if (*(_IO_FILE **)(in_FS_OFFSET + 0x28) == local_30) {
            __cxa_throw(pOVar5,&OSError::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00602864;
        }
        ebuf.length = (size_t)iVar1;
        pSVar6 = (Streams *)&this->stream_->error_;
        goto LAB_00602652;
      }
    }
    else {
      if (msg != (char *)0x0) {
        sVar3 = fwrite(msg,1,length,__s);
        if ((int)sVar3 < (int)length) {
          piVar4 = __errno_location();
          if ((*piVar4 != 0x16) && (*piVar4 != 0x20)) {
            pOVar5 = (OSError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_68,"fwrite error",&local_a9);
            OSError::OSError(pOVar5,&local_68,*piVar4);
            if (*(_IO_FILE **)(in_FS_OFFSET + 0x28) == local_30) {
              __cxa_throw(pOVar5,&OSError::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00602864;
          }
        }
      }
      pSVar6 = this->stream_;
LAB_00602652:
      std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *)pSVar6);
    }
    std::pair<subprocess::Buffer,_subprocess::Buffer>::
    pair<subprocess::Buffer,_subprocess::Buffer,_true>(__return_storage_ptr__,&obuf,&ebuf);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&ebuf);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&obuf);
  }
  if (*(_IO_FILE **)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_00602864:
  __stack_chk_fail();
}

Assistant:

inline std::pair<OutBuffer, ErrBuffer>
  Communication::communicate(const char* msg, size_t length)
  {
    // Optimization from subprocess.py
    // If we are using one pipe, or no pipe
    // at all, using select() or threads is unnecessary.
    auto hndls = {stream_->input(), stream_->output(), stream_->error()};
    int count = std::count(std::begin(hndls), std::end(hndls), nullptr);
    const int len_conv = length;

    if (count >= 2) {
      OutBuffer obuf;
      ErrBuffer ebuf;
      if (stream_->input()) {
        if (msg) {
          int wbytes = std::fwrite(msg, sizeof(char), length, stream_->input());
          if (wbytes < len_conv) {
            if (errno != EPIPE && errno != EINVAL) {
              throw OSError("fwrite error", errno);
            }
          }
        }
        // Close the input stream
        stream_->input_.reset();
      } else if (stream_->output()) {
        // Read till EOF
        // ATTN: This could be blocking, if the process
        // at the other end screws up, we get screwed as well
        obuf.add_cap(out_buf_cap_);

        int rbytes = util::read_all(
                            stream_->output(),
                            obuf.buf);

        if (rbytes == -1) {
          throw OSError("read to obuf failed", errno);
        }

        obuf.length = rbytes;
        // Close the output stream
        stream_->output_.reset();

      } else if (stream_->error()) {
        // Same screwness applies here as well
        ebuf.add_cap(err_buf_cap_);

        int rbytes = util::read_atmost_n(
                                  stream_->error(),
                                  ebuf.buf.data(),
                                  ebuf.buf.size());

        if (rbytes == -1) {
          throw OSError("read to ebuf failed", errno);
        }

        ebuf.length = rbytes;
        // Close the error stream
        stream_->error_.reset();
      }
      return std::make_pair(std::move(obuf), std::move(ebuf));
    }

    return communicate_threaded(msg, length);
  }